

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLParser.cpp
# Opt level: O0

Token * __thiscall llvm::yaml::Scanner::peekNext(Scanner *this)

{
  bool bVar1;
  bool bVar2;
  Token *pTVar3;
  undefined1 local_70 [8];
  SimpleKey SK;
  bool NeedMore;
  Scanner *this_local;
  
  bVar2 = false;
  while( true ) {
    bVar1 = AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>
            ::empty(&this->TokenQueue);
    if (((bVar1) || (bVar2)) && (bVar2 = fetchMoreTokens(this), !bVar2)) {
      AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>
      ::clear(&this->TokenQueue);
      memset(&SK.FlowLevel,0,0x38);
      Token::Token((Token *)&SK.FlowLevel);
      AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>
      ::push_back(&this->TokenQueue,(Token *)&SK.FlowLevel);
      Token::~Token((Token *)&SK.FlowLevel);
      pTVar3 = AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>
               ::front(&this->TokenQueue);
      return pTVar3;
    }
    bVar2 = AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>
            ::empty(&this->TokenQueue);
    if (bVar2) {
      __assert_fail("!TokenQueue.empty() && \"fetchMoreTokens lied about getting tokens!\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/YAMLParser.cpp"
                    ,0x31e,"Token &llvm::yaml::Scanner::peekNext()");
    }
    removeStaleSimpleKeyCandidates(this);
    anon_unknown.dwarf_430071::SimpleKey::SimpleKey((SimpleKey *)local_70);
    local_70 = (undefined1  [8])
               AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>
               ::begin(&this->TokenQueue);
    bVar2 = is_contained<llvm::SmallVector<(anonymous_namespace)::SimpleKey,4u>&,(anonymous_namespace)::SimpleKey>
                      (&this->SimpleKeys,(SimpleKey *)local_70);
    if (!bVar2) break;
    bVar2 = true;
  }
  pTVar3 = AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>
           ::front(&this->TokenQueue);
  return pTVar3;
}

Assistant:

Token &Scanner::peekNext() {
  // If the current token is a possible simple key, keep parsing until we
  // can confirm.
  bool NeedMore = false;
  while (true) {
    if (TokenQueue.empty() || NeedMore) {
      if (!fetchMoreTokens()) {
        TokenQueue.clear();
        TokenQueue.push_back(Token());
        return TokenQueue.front();
      }
    }
    assert(!TokenQueue.empty() &&
            "fetchMoreTokens lied about getting tokens!");

    removeStaleSimpleKeyCandidates();
    SimpleKey SK;
    SK.Tok = TokenQueue.begin();
    if (!is_contained(SimpleKeys, SK))
      break;
    else
      NeedMore = true;
  }
  return TokenQueue.front();
}